

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O2

size_t __thiscall BamTools::Internal::RollingBuffer::Read(RollingBuffer *this,char *dest,size_t max)

{
  char *__src;
  size_t sVar1;
  ulong uVar2;
  ulong __n;
  
  if (this->m_totalBufferSize < max) {
    max = this->m_totalBufferSize;
  }
  for (uVar2 = 0; __n = max - uVar2, uVar2 <= max && __n != 0; uVar2 = uVar2 + __n) {
    __src = ReadPointer(this);
    sVar1 = BlockSize(this);
    if (sVar1 < __n) {
      __n = sVar1;
    }
    if (dest != (char *)0x0) {
      memcpy(dest + uVar2,__src,__n);
    }
    Free(this,__n);
  }
  return uVar2;
}

Assistant:

std::size_t RollingBuffer::Read(char* dest, std::size_t max)
{

    std::size_t bytesToRead = std::min(Size(), max);
    std::size_t bytesReadSoFar = 0;

    while (bytesReadSoFar < bytesToRead) {
        const char* readPtr = ReadPointer();
        std::size_t blockBytes = std::min((bytesToRead - bytesReadSoFar), BlockSize());
        if (dest) {
            std::memcpy(dest + bytesReadSoFar, readPtr, blockBytes);
        }
        bytesReadSoFar += blockBytes;
        Free(blockBytes);
    }

    return bytesReadSoFar;
}